

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persncal.cpp
# Opt level: O0

void __thiscall
icu_63::PersianCalendar::handleComputeFields
          (PersianCalendar *this,int32_t julianDay,UErrorCode *param_2)

{
  short sVar1;
  int value;
  int32_t iVar2;
  int iVar3;
  int64_t iVar4;
  int32_t farvardin1;
  int32_t daysSinceEpoch;
  int32_t dayOfYear;
  int32_t dayOfMonth;
  int32_t month;
  int32_t year;
  UErrorCode *param_2_local;
  int32_t julianDay_local;
  PersianCalendar *this_local;
  
  iVar4 = ClockMath::floorDivide((long)(julianDay + -0x1dbaa0) * 0x21 + 3,0x2f15);
  value = (int)iVar4 + 1;
  iVar2 = ClockMath::floorDivide(value * 8 + 0x15,0x21);
  iVar3 = (julianDay + -0x1dbaa0) - ((int)iVar4 * 0x16d + iVar2);
  if (iVar3 < 0xd8) {
    dayOfYear = iVar3 / 0x1f;
  }
  else {
    dayOfYear = (iVar3 + -6) / 0x1e;
  }
  sVar1 = kPersianNumDays[dayOfYear];
  Calendar::internalSet(&this->super_Calendar,UCAL_ERA,0);
  Calendar::internalSet(&this->super_Calendar,UCAL_YEAR,value);
  Calendar::internalSet(&this->super_Calendar,UCAL_EXTENDED_YEAR,value);
  Calendar::internalSet(&this->super_Calendar,UCAL_MONTH,dayOfYear);
  Calendar::internalSet(&this->super_Calendar,UCAL_DATE,(iVar3 - sVar1) + 1);
  Calendar::internalSet(&this->super_Calendar,UCAL_DAY_OF_YEAR,iVar3 + 1);
  return;
}

Assistant:

void PersianCalendar::handleComputeFields(int32_t julianDay, UErrorCode &/*status*/) {
    int32_t year, month, dayOfMonth, dayOfYear;

    int32_t daysSinceEpoch = julianDay - PERSIAN_EPOCH;
    year = 1 + (int32_t)ClockMath::floorDivide(33 * (int64_t)daysSinceEpoch + 3, (int64_t)12053);

    int32_t farvardin1 = 365 * (year - 1) + ClockMath::floorDivide(8 * year + 21, 33);
    dayOfYear = (daysSinceEpoch - farvardin1); // 0-based
    if (dayOfYear < 216) { // Compute 0-based month
        month = dayOfYear / 31;
    } else {
        month = (dayOfYear - 6) / 30;
    }
    dayOfMonth = dayOfYear - kPersianNumDays[month] + 1;
    ++dayOfYear; // Make it 1-based now

    internalSet(UCAL_ERA, 0);
    internalSet(UCAL_YEAR, year);
    internalSet(UCAL_EXTENDED_YEAR, year);
    internalSet(UCAL_MONTH, month);
    internalSet(UCAL_DAY_OF_MONTH, dayOfMonth);
    internalSet(UCAL_DAY_OF_YEAR, dayOfYear);
}